

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O3

void __thiscall duckdb::DuckDB::LoadStaticExtension<duckdb::CoreFunctionsExtension>(DuckDB *this)

{
  bool bVar1;
  DatabaseInstance *this_00;
  CoreFunctionsExtension extension;
  Extension local_e0;
  string local_d8;
  undefined1 local_b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_e0._vptr_Extension = (_func_int **)&PTR__Extension_0199cbc8;
  CoreFunctionsExtension::Name_abi_cxx11_((string *)local_b8,(CoreFunctionsExtension *)&local_e0);
  bVar1 = ExtensionIsLoaded(this,(string *)local_b8);
  if ((undefined1 *)CONCAT71(local_b8._1_7_,local_b8[0]) != local_b8 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_b8._1_7_,local_b8[0]));
  }
  if (!bVar1) {
    CoreFunctionsExtension::Load((CoreFunctionsExtension *)&local_e0,this);
    local_b8._16_8_ = 0;
    local_a0._M_local_buf[0] = '\0';
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_b8[0] = STATICALLY_LINKED;
    local_b8._8_8_ = &local_a0;
    local_90._M_p = (pointer)&local_80;
    local_70._M_p = (pointer)&local_60;
    local_50._M_p = (pointer)&local_40;
    CoreFunctionsExtension::Version_abi_cxx11_(&local_d8,(CoreFunctionsExtension *)&local_e0);
    ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    this_00 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->instance);
    CoreFunctionsExtension::Name_abi_cxx11_(&local_d8,(CoreFunctionsExtension *)&local_e0);
    DatabaseInstance::SetExtensionLoaded(this_00,&local_d8,(ExtensionInstallInfo *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._8_8_ != &local_a0) {
      operator_delete((void *)local_b8._8_8_);
    }
  }
  Extension::~Extension(&local_e0);
  return;
}

Assistant:

void LoadStaticExtension() {
		T extension;
		if (ExtensionIsLoaded(extension.Name())) {
			return;
		}
		extension.Load(*this);
		ExtensionInstallInfo install_info;
		install_info.mode = ExtensionInstallMode::STATICALLY_LINKED;
		install_info.version = extension.Version();
		instance->SetExtensionLoaded(extension.Name(), install_info);
	}